

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

void __thiscall
cppcms::url_mapper::data::map
          (data *this,string_key *key,string_key *full_url,streamable **params,size_t params_no,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_default,
          map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data_helpers_override,ostream *out)

{
  data *this_00;
  url_mapper *puVar1;
  streamable *par_ptr;
  streamable stream_url;
  undefined1 local_90 [48];
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> url;
  
  url.formatting = get_entry(this,key,params_no,full_url);
  if (this->parent == (application *)0x0) {
    std::operator<<(out,(string *)&this->root);
    write(this,(int)url.formatting,params,params_no);
  }
  else {
    url.data_helpers_override = data_helpers_override;
    url.self = this;
    url.params = params;
    url.params_no = params_no;
    url.data_helpers_default = data_helpers_default;
    filters::streamable::
    streamable<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
              (&stream_url,&url);
    par_ptr = &stream_url;
    puVar1 = application::mapper(this->parent);
    this_00 = (puVar1->d).ptr_;
    string_key::string_key((string_key *)local_90,&this->this_name);
    map(this_00,(string_key *)local_90,full_url,&par_ptr,1,data_helpers_default,
        data_helpers_override,out);
    std::__cxx11::string::~string((string *)(local_90 + 0x10));
    filters::streamable::~streamable(&stream_url);
  }
  return;
}

Assistant:

void map(	string_key const &key,
				string_key const &full_url,
				filters::streamable const * const *params,
				size_t params_no,
				std::map<string_key,std::string> const &data_helpers_default,
				std::map<string_key,std::string> const &data_helpers_override,
				std::ostream &out) const
		{
			entry const &formatting = get_entry(key,params_no,full_url);

			if(parent) {
				stream_it<data,entry> url = 
				{ 
					this,
					&formatting,
					params,
					params_no,
					&data_helpers_default,
					&data_helpers_override
				};

				filters::streamable stream_url(url);
				filters::streamable const *par_ptr=&stream_url;
				parent->mapper().d->map(this_name,full_url,&par_ptr,1,	data_helpers_default,
											data_helpers_override,out);
			}
			else {
				out << root;
				write(formatting,params,params_no,data_helpers_default,data_helpers_override,out);
			}

		}